

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O3

size_t count_words(string *input)

{
  istream *piVar1;
  runtime_error *this;
  size_t sVar2;
  string word;
  ifstream fin;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)input,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    local_240 = 0;
    local_238[0] = 0;
    sVar2 = 0;
    local_248 = local_238;
    while( true ) {
      piVar1 = std::operator>>((istream *)local_228,(string *)&local_248);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      sVar2 = sVar2 + 1;
    }
    if (local_248 != local_238) {
      operator_delete(local_248);
    }
    std::ifstream::~ifstream(local_228);
    return sVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Open input file failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t count_words(const std::string& input)
{
    std::ifstream fin(input, std::ios::binary);
    if (!fin)
    {
        throw std::runtime_error("Open input file failed!");
    }

    size_t words;
    std::string word;
    for (words = 0; fin >> word; ++words)
        ;

    return words;
}